

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

int32_t lj_lib_checkint(lua_State *L,int narg)

{
  int iVar1;
  ulong uVar2;
  TValue *o;
  
  o = L->base + (long)narg + -1;
  if (o < L->top) {
    uVar2 = o->it64 >> 0x2f;
    if (uVar2 < 0xfffffffffffffff3) {
LAB_0015297f:
      return (int)o->n;
    }
    if (uVar2 == 0xfffffffffffffffb) {
      iVar1 = lj_strscan_num((GCstr *)(o->it64 & 0x7fffffffffff),o);
      if (iVar1 != 0) goto LAB_0015297f;
    }
  }
  lj_err_argt(L,narg,3);
}

Assistant:

int32_t lj_lib_checkint(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top && lj_strscan_numberobj(o)))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else {
    int32_t i = lj_num2int(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return i;
  }
}